

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::ChatBoxStyle> __thiscall gui::DefaultTheme::makeChatBoxStyle(DefaultTheme *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Gui *in_RDI;
  shared_ptr<gui::ChatBoxStyle> sVar1;
  shared_ptr<gui::ChatBoxStyle> *style;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ChatBoxStyle *in_stack_ffffffffffffffa0;
  Vector3<float> local_30 [2];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::ChatBoxStyle,gui::Gui_const&>(in_RDI);
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169c5d);
  ChatBoxStyle::setFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169c78);
  ChatBoxStyle::setOutlineColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169c93);
  ChatBoxStyle::setOutlineThickness(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169caf);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffffa0);
  ChatBoxStyle::setFont
            (in_stack_ffffffffffffffa0,
             (Font *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169ce4);
  ChatBoxStyle::setCharacterSize(in_stack_ffffffffffffffa0,(uint)in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169cfd);
  ChatBoxStyle::setTextFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169d18);
  ChatBoxStyle::setInvertedTextFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169d33);
  ChatBoxStyle::setHighlightFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x169d4e);
  sf::Vector3<float>::Vector3(local_30,8.0,1.0,*(float *)(in_RSI + 0x50));
  ChatBoxStyle::setTextPadding
            (this_00,(Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<gui::ChatBoxStyle>)
         sVar1.super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChatBoxStyle> DefaultTheme::makeChatBoxStyle() const {
    auto style = std::make_shared<ChatBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(colorGray);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(colorGray2);

    style->setInvertedTextFillColor(sf::Color::Black);
    style->setHighlightFillColor(colorLightBlueTransparent);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}